

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O3

IterateResult __thiscall gl3cts::TransformFeedback::DrawXFBStream::iterate(DrawXFBStream *this)

{
  ostringstream *poVar1;
  GLuint GVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  ContextType ctxType;
  deUint32 dVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  char *description;
  qpTestResult testResult;
  TestContext *this_00;
  GLint max_vertex_streams;
  int local_1a4;
  undefined1 local_1a0 [120];
  ios_base local_128 [264];
  
  iVar6 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
  ctxType.super_ApiType.m_bits = (ApiType)(*this->m_context->m_renderCtx->_vptr_RenderContext[2])();
  bVar3 = glu::contextSupports(ctxType,(ApiType)0x104);
  bVar4 = glu::ContextInfo::isExtensionSupported
                    (this->m_context->m_contextInfo,"GL_ARB_transform_feedback3");
  bVar5 = glu::ContextInfo::isExtensionSupported
                    (this->m_context->m_contextInfo,"GL_ARB_gpu_shader5");
  local_1a4 = 0;
  if ((bVar3) || (bVar4 && bVar5)) {
    (**(code **)(CONCAT44(extraout_var,iVar6) + 0x868))(0x8e71,&local_1a4);
    dVar7 = (**(code **)(CONCAT44(extraout_var,iVar6) + 0x800))();
    glu::checkError(dVar7,"glGetIntegerv call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x1501);
    if (local_1a4 < 2) goto LAB_0085d9fb;
    prepareObjects(this);
    GVar2 = this->m_program_id_generate;
    iVar6 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar6) + 0x1680))(GVar2);
    dVar7 = (**(code **)(CONCAT44(extraout_var_00,iVar6) + 0x800))();
    glu::checkError(dVar7,"glUseProgram call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x15b5);
    drawForXFB(this);
    bVar3 = inspectQueries(this);
    GVar2 = this->m_program_id_draw;
    iVar6 = (*this->m_context->m_renderCtx->_vptr_RenderContext[3])();
    (**(code **)(CONCAT44(extraout_var_01,iVar6) + 0x1680))(GVar2);
    dVar7 = (**(code **)(CONCAT44(extraout_var_01,iVar6) + 0x800))();
    glu::checkError(dVar7,"glUseProgram call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl3cTransformFeedbackTests.cpp"
                    ,0x15b5);
    setupVertexArray(this,this->m_bo_id[0]);
    drawForFramebuffer(this,0);
    setupVertexArray(this,this->m_bo_id[1]);
    drawForFramebuffer(this,1);
    if (!bVar3) {
      clean(this);
LAB_0085da8a:
      local_1a0._0_8_ = this->m_context->m_testCtx->m_log;
      poVar1 = (ostringstream *)(local_1a0 + 8);
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Draw XFB Stream have failed.",0x1c);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream(poVar1);
      std::ios_base::~ios_base(local_128);
      this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
      description = "Fail";
      testResult = QP_TEST_RESULT_FAIL;
      goto LAB_0085da6d;
    }
    bVar3 = check(this);
    clean(this);
    if (!bVar3) goto LAB_0085da8a;
  }
  else {
LAB_0085d9fb:
    clean(this);
  }
  local_1a0._0_8_ = this->m_context->m_testCtx->m_log;
  poVar1 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Draw XFB Stream have passed.",0x1c);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base(local_128);
  this_00 = (this->super_TestCase).super_TestCase.super_TestNode.m_testCtx;
  description = "Pass";
  testResult = QP_TEST_RESULT_PASS;
LAB_0085da6d:
  tcu::TestContext::setTestResult(this_00,testResult,description);
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult gl3cts::TransformFeedback::DrawXFBStream::iterate(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Initializations. */
	bool is_at_least_gl_40  = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 0)));
	bool is_arb_tf_3		= m_context.getContextInfo().isExtensionSupported("GL_ARB_transform_feedback3");
	bool is_arb_gpu_shader5 = m_context.getContextInfo().isExtensionSupported("GL_ARB_gpu_shader5");

	glw::GLint max_vertex_streams = 0;

	bool is_ok		= true;
	bool test_error = false;

	/* Tests. */
	try
	{
		if (is_at_least_gl_40 || (is_arb_tf_3 && is_arb_gpu_shader5))
		{
			gl.getIntegerv(GL_MAX_VERTEX_STREAMS, &max_vertex_streams);
			GLU_EXPECT_NO_ERROR(gl.getError(), "glGetIntegerv call failed.");

			if (max_vertex_streams >= 2)
			{
				prepareObjects();

				useProgram(m_program_id_generate);

				drawForXFB();

				is_ok = is_ok && inspectQueries();

				useProgram(m_program_id_draw);

				setupVertexArray(m_bo_id[0]);

				drawForFramebuffer(0);

				setupVertexArray(m_bo_id[1]);

				drawForFramebuffer(1);

				is_ok = is_ok && check();
			}
		}
	}
	catch (...)
	{
		is_ok	  = false;
		test_error = true;
	}

	/* Clean GL objects. */
	clean();

	/* Result's setup. */
	if (is_ok)
	{
		/* Log success. */
		m_context.getTestContext().getLog() << tcu::TestLog::Message << "Draw XFB Stream have passed."
											<< tcu::TestLog::EndMessage;

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (test_error)
		{
			/* Log error. */
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Draw XFB Stream have approached error."
												<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			/* Log fail. */
			m_context.getTestContext().getLog() << tcu::TestLog::Message << "Draw XFB Stream have failed."
												<< tcu::TestLog::EndMessage;

			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}